

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.c
# Opt level: O0

Bool prvTidyAddGenerator(TidyDocImpl *doc)

{
  int iVar1;
  Node *element;
  ctmbstr ptVar2;
  AttVal *pAVar3;
  tmbstr ptVar4;
  Node *node_00;
  tmbchar local_138 [8];
  tmbchar buf [256];
  Node *head;
  Node *node;
  AttVal *attval;
  TidyDocImpl *doc_local;
  
  element = prvTidyFindHEAD(doc);
  if (element != (Node *)0x0) {
    ptVar2 = tidyLibraryVersion();
    prvTidytmbsnprintf(local_138,0x100,"HTML Tidy for HTML5 for Linux version %s",ptVar2);
    for (head = element->content; head != (Node *)0x0; head = head->next) {
      if ((((((head != (Node *)0x0) && (head->tag != (Dict *)0x0)) &&
            (head->tag->id == TidyTag_META)) &&
           ((pAVar3 = prvTidyAttrGetById(head,TidyAttr_NAME), pAVar3 != (AttVal *)0x0 &&
            (pAVar3->value != (tmbstr)0x0)))) &&
          ((iVar1 = prvTidytmbstrcasecmp(pAVar3->value,"generator"), iVar1 == 0 &&
           ((pAVar3 = prvTidyAttrGetById(head,TidyAttr_CONTENT), pAVar3 != (AttVal *)0x0 &&
            (pAVar3->value != (tmbstr)0x0)))))) &&
         (iVar1 = prvTidytmbstrncasecmp(pAVar3->value,"HTML Tidy",9), iVar1 == 0)) {
        (*doc->allocator->vtbl->free)(doc->allocator,pAVar3->value);
        ptVar4 = prvTidytmbstrdup(doc->allocator,local_138);
        pAVar3->value = ptVar4;
        return no;
      }
    }
    if ((doc->config).value[1].v == 0) {
      node_00 = prvTidyInferredTag(doc,TidyTag_META);
      prvTidyAddAttribute(doc,node_00,"name","generator");
      prvTidyAddAttribute(doc,node_00,"content",local_138);
      prvTidyInsertNodeAtStart(element,node_00);
      return yes;
    }
  }
  return no;
}

Assistant:

Bool TY_(AddGenerator)( TidyDocImpl* doc )
{
    AttVal *attval;
    Node *node;
    Node *head = TY_(FindHEAD)( doc );
    tmbchar buf[256];
    
    if (head)
    {
#ifdef PLATFORM_NAME
        TY_(tmbsnprintf)(buf, sizeof(buf), "HTML Tidy for HTML5 for "PLATFORM_NAME" version %s",
                         tidyLibraryVersion());
#else
        TY_(tmbsnprintf)(buf, sizeof(buf), "HTML Tidy for HTML5 version %s", tidyLibraryVersion());
#endif

        for ( node = head->content; node; node = node->next )
        {
            if ( nodeIsMETA(node) )
            {
                attval = TY_(AttrGetById)(node, TidyAttr_NAME);

                if (AttrValueIs(attval, "generator"))
                {
                    attval = TY_(AttrGetById)(node, TidyAttr_CONTENT);

                    if (AttrHasValue(attval) &&
                        TY_(tmbstrncasecmp)(attval->value, "HTML Tidy", 9) == 0)
                    {
                        /* update the existing content to reflect the */
                        /* actual version of Tidy currently being used */
                        
                        TidyDocFree(doc, attval->value);
                        attval->value = TY_(tmbstrdup)(doc->allocator, buf);
                        return no;
                    }
                }
            }
        }

        if ( cfg(doc, TidyAccessibilityCheckLevel) == 0 )
        {
            node = TY_(InferredTag)(doc, TidyTag_META);
            TY_(AddAttribute)( doc, node, "name", "generator" );
            TY_(AddAttribute)( doc, node, "content", buf );
            TY_(InsertNodeAtStart)( head, node );
            return yes;
        }
    }

    return no;
}